

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_strnspn(char *s,char *n,size_t len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *p;
  
  for (pcVar2 = s; pcVar3 = n, pcVar2 < s + len; pcVar2 = pcVar2 + 1) {
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') goto LAB_001061e3;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar2 != cVar1);
  }
LAB_001061e3:
  return (long)pcVar2 - (long)s;
}

Assistant:

size_t coda_strnspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}

		if (!*x) break;
	}

	return p - s;
}